

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_greedy<true>(cb_explore *data,single_learner *base,example *ec)

{
  uint32_t i;
  uint uVar1;
  action_scores probs;
  action_score local_80;
  v_array<ACTION_SCORE::action_score> local_78;
  score_iterator local_50;
  score_iterator local_40;
  
  local_78._begin = (action_score *)(ec->pred).scalars._begin;
  local_78._end = (action_score *)(ec->pred).scalars._end;
  local_78.end_array = (action_score *)(ec->pred).scalars.end_array;
  local_78.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&local_78);
  LEARNER::learner<char,_example>::learn(base,ec,0);
  v_array<ACTION_SCORE::action_score>::resize(&local_78,(ulong)(data->cbcs).num_actions);
  for (uVar1 = 0; uVar1 < (data->cbcs).num_actions; uVar1 = uVar1 + 1) {
    local_80.score = 0.0;
    local_80.action = uVar1;
    v_array<ACTION_SCORE::action_score>::push_back(&local_78,&local_80);
  }
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40._p = local_78._begin;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = local_78._end;
  exploration::generate_epsilon_greedy<ACTION_SCORE::score_iterator>
            (data->epsilon,(ec->pred).multiclass - 1,&local_40,&local_50);
  (ec->pred).scalars._begin = (float *)local_78._begin;
  (ec->pred).scalars._end = (float *)local_78._end;
  (ec->pred).scalars.end_array = (float *)local_78.end_array;
  (ec->pred).scalars.erase_count = local_78.erase_count;
  return;
}

Assistant:

void predict_or_learn_greedy(cb_explore& data, single_learner& base, example& ec)
{
  // Explore uniform random an epsilon fraction of the time.
  // TODO: pointers are copied here. What happens if base.learn/base.predict re-allocs?
  // ec.pred.a_s = probs; will restore the than free'd memory
  action_scores probs = ec.pred.a_s;
  probs.clear();

  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  // pre-allocate pdf
  probs.resize(data.cbcs.num_actions);
  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0});
  generate_epsilon_greedy(data.epsilon, ec.pred.multiclass - 1, begin_scores(probs), end_scores(probs));

  ec.pred.a_s = probs;
}